

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  undefined1 local_148 [8];
  string pdbName;
  string impName;
  undefined1 local_100 [8];
  string soName;
  string name;
  string pdbName_1;
  string impName_1;
  undefined1 local_78 [8];
  string name_1;
  allocator local_41;
  undefined1 local_40 [8];
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *realName;
  
  msg.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_40,"NormalGetRealName called on imported target: ",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator+=((string *)local_40,(string *)psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  TVar2 = GetType(this);
  if (TVar2 == EXECUTABLE) {
    std::__cxx11::string::string((string *)local_78);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)(pdbName_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
    GetExecutableNames(this,(string *)local_78,__return_storage_ptr__,
                       (string *)(pdbName_1.field_2._M_local_buf + 8),
                       (string *)(name.field_2._M_local_buf + 8),(string *)msg.field_2._8_8_);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(pdbName_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    std::__cxx11::string::string((string *)(soName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_100);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)(pdbName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_148);
    GetLibraryNames(this,(string *)(soName.field_2._M_local_buf + 8),(string *)local_100,
                    __return_storage_ptr__,(string *)(pdbName.field_2._M_local_buf + 8),
                    (string *)local_148,(string *)msg.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)(pdbName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)(soName.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetRealName(
  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "NormalGetRealName called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(cmake::INTERNAL_ERROR, msg);
  }

  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Compute the real name that will be built.
    std::string name;
    std::string realName;
    std::string impName;
    std::string pdbName;
    this->GetExecutableNames(name, realName, impName, pdbName, config);
    return realName;
  }
  // Compute the real name that will be built.
  std::string name;
  std::string soName;
  std::string realName;
  std::string impName;
  std::string pdbName;
  this->GetLibraryNames(name, soName, realName, impName, pdbName, config);
  return realName;
}